

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O1

int tcsicmp_ascii(tchar_t *a,tchar_t *b)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  
  lVar3 = 0;
  while( true ) {
    bVar1 = a[lVar3];
    uVar4 = (uint)(char)bVar1;
    bVar2 = b[lVar3];
    iVar6 = (int)(char)bVar2;
    uVar7 = uVar4;
    if ((bVar2 != bVar1) &&
       (((uVar4 & 0xffffffdf) - 0x5b < 0xffffffe6 ||
        (uVar7 = uVar4 & 0xffffffdf, ((bVar2 ^ bVar1) & 0xdf) != 0)))) break;
    if (uVar7 == 0) {
      return 0;
    }
    bVar1 = a[lVar3 + 1];
    uVar4 = (uint)(char)bVar1;
    bVar2 = b[lVar3 + 1];
    iVar6 = (int)(char)bVar2;
    uVar7 = uVar4;
    if ((bVar2 != bVar1) &&
       (((uVar4 & 0xffffffdf) - 0x5b < 0xffffffe6 ||
        (uVar7 = uVar4 & 0xffffffdf, ((bVar2 ^ bVar1) & 0xdf) != 0)))) break;
    if (uVar7 == 0) {
      return 0;
    }
    bVar1 = a[lVar3 + 2];
    uVar4 = (uint)(char)bVar1;
    bVar2 = b[lVar3 + 2];
    iVar6 = (int)(char)bVar2;
    uVar7 = uVar4;
    if ((bVar2 != bVar1) &&
       (((uVar4 & 0xffffffdf) - 0x5b < 0xffffffe6 ||
        (uVar7 = uVar4 & 0xffffffdf, ((bVar2 ^ bVar1) & 0xdf) != 0)))) break;
    if (uVar7 == 0) {
      return 0;
    }
    bVar1 = a[lVar3 + 3];
    uVar4 = (uint)(char)bVar1;
    bVar2 = b[lVar3 + 3];
    iVar6 = (int)(char)bVar2;
    uVar7 = uVar4;
    if ((bVar2 != bVar1) &&
       (((uVar4 & 0xffffffdf) - 0x5b < 0xffffffe6 ||
        (uVar7 = uVar4 & 0xffffffdf, ((bVar2 ^ bVar1) & 0xdf) != 0)))) break;
    if (uVar7 == 0) {
      return 0;
    }
    lVar3 = lVar3 + 4;
  }
  uVar7 = uVar4 - 0x20;
  if (0x19 < uVar4 - 0x61) {
    uVar7 = uVar4;
  }
  iVar5 = iVar6 + -0x20;
  if (0x19 < iVar6 - 0x61U) {
    iVar5 = iVar6;
  }
  return uVar7 - iVar5;
}

Assistant:

int tcsicmp_ascii(const tchar_t* a,const tchar_t* b)
{
    int ca,cb;
    for (;;a+=4,b+=4)
    {
        icmp_ascii(a,b,0)
        icmp_ascii(a,b,1)
        icmp_ascii(a,b,2)
        icmp_ascii(a,b,3)
    }
    return ascii_upper(ca)-ascii_upper(cb);
}